

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
::count<std::__cxx11::string>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
           *this,key_arg<std::__cxx11::basic_string<char>_> *key)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  iterator iVar3;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_11;
  
  sVar2 = std::
          hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()(&local_11,key);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar2;
  iVar3 = find<std::__cxx11::string>
                    (this,key,SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
                              SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0));
  return (ulong)(iVar3.ctrl_ != (ctrl_t *)(*(long *)this + *(long *)(this + 0x18)));
}

Assistant:

size_t count(const key_arg<K>& key) const
			{
				return find(key) == end() ? size_t(0) : size_t(1);
			}